

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple9.h
# Opt level: O0

void __thiscall
FastPForLib::Simple9<true,_false>::encodeArray
          (Simple9<true,_false> *this,uint32_t *in,size_t length,uint32_t *out,size_t *nvalue)

{
  bool bVar1;
  runtime_error *prVar2;
  undefined4 *in_RCX;
  ulong in_RDX;
  uint32_t *in_RSI;
  long *in_R8;
  uint32_t i_15;
  uint32_t i_14;
  uint32_t i_13;
  uint32_t i_12;
  uint32_t i_11;
  uint32_t i_10;
  uint32_t i_9;
  uint32_t i_8;
  uint32_t i_7;
  uint32_t i_6;
  uint32_t i_5;
  uint32_t i_4;
  uint32_t i_3;
  uint32_t i_2;
  uint32_t i_1;
  uint32_t i;
  bool becareful;
  size_t ValuesRemaining;
  uint32_t *initout;
  uint32_t NumberOfValuesCoded;
  uint local_c0;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  ulong local_40;
  uint local_2c;
  uint32_t *local_20;
  uint32_t *local_10;
  
  local_20 = in_RCX + 1;
  *in_RCX = (int)in_RDX;
  local_40 = in_RDX;
  local_10 = in_RSI;
  do {
    if (local_40 < 0x1c) {
      do {
        if (local_40 == 0) {
          *in_R8 = (long)local_20 - (long)in_RCX >> 2;
          return;
        }
        bVar1 = Simple9<true,false>::tryme<28u,1u>(local_10,local_40);
        local_c0 = (uint)local_40;
        if (bVar1) {
          *local_20 = 0;
          local_a4 = local_c0;
          if (0x1b < local_40) {
            local_a4 = 0x1c;
          }
          local_2c = local_a4;
          for (local_78 = 0; local_78 < local_a4; local_78 = local_78 + 1) {
            bit_writer(local_20,*local_10,1);
            local_10 = local_10 + 1;
          }
          *local_20 = *local_20 << (0x1cU - (char)local_a4 & 0x1f);
        }
        else {
          bVar1 = Simple9<true,false>::tryme<14u,2u>(local_10,local_40);
          if (bVar1) {
            *local_20 = 1;
            local_a8 = local_c0;
            if (0xd < local_40) {
              local_a8 = 0xe;
            }
            local_2c = local_a8;
            for (local_7c = 0; local_7c < local_a8; local_7c = local_7c + 1) {
              bit_writer(local_20,*local_10,2);
              local_10 = local_10 + 1;
            }
            *local_20 = *local_20 << ((char)local_a8 * -2 + 0x1cU & 0x1f);
          }
          else {
            bVar1 = Simple9<true,false>::tryme<9u,3u>(local_10,local_40);
            if (bVar1) {
              *local_20 = 2;
              local_ac = local_c0;
              if (8 < local_40) {
                local_ac = 9;
              }
              local_2c = local_ac;
              for (local_80 = 0; local_80 < local_ac; local_80 = local_80 + 1) {
                bit_writer(local_20,*local_10,3);
                local_10 = local_10 + 1;
              }
              *local_20 = *local_20 << ((char)local_ac * -3 + 0x1cU & 0x1f);
            }
            else {
              bVar1 = Simple9<true,false>::tryme<7u,4u>(local_10,local_40);
              if (bVar1) {
                *local_20 = 3;
                local_b0 = local_c0;
                if (6 < local_40) {
                  local_b0 = 7;
                }
                local_2c = local_b0;
                for (local_84 = 0; local_84 < local_b0; local_84 = local_84 + 1) {
                  bit_writer(local_20,*local_10,4);
                  local_10 = local_10 + 1;
                }
                *local_20 = *local_20 << (0x1cU - (char)(local_b0 << 2) & 0x1f);
              }
              else {
                bVar1 = Simple9<true,false>::tryme<5u,5u>(local_10,local_40);
                if (bVar1) {
                  *local_20 = 4;
                  local_b4 = local_c0;
                  if (4 < local_40) {
                    local_b4 = 5;
                  }
                  local_2c = local_b4;
                  for (local_88 = 0; local_88 < local_b4; local_88 = local_88 + 1) {
                    bit_writer(local_20,*local_10,5);
                    local_10 = local_10 + 1;
                  }
                  *local_20 = *local_20 << ((char)local_b4 * -5 + 0x1cU & 0x1f);
                }
                else {
                  bVar1 = Simple9<true,false>::tryme<4u,7u>(local_10,local_40);
                  if (bVar1) {
                    *local_20 = 5;
                    local_b8 = local_c0;
                    if (3 < local_40) {
                      local_b8 = 4;
                    }
                    local_2c = local_b8;
                    for (local_8c = 0; local_8c < local_b8; local_8c = local_8c + 1) {
                      bit_writer(local_20,*local_10,7);
                      local_10 = local_10 + 1;
                    }
                    *local_20 = *local_20 << ((char)local_b8 * -7 + 0x1cU & 0x1f);
                  }
                  else {
                    bVar1 = Simple9<true,false>::tryme<3u,9u>(local_10,local_40);
                    if (bVar1) {
                      *local_20 = 6;
                      local_bc = local_c0;
                      if (2 < local_40) {
                        local_bc = 3;
                      }
                      local_2c = local_bc;
                      for (local_90 = 0; local_90 < local_bc; local_90 = local_90 + 1) {
                        bit_writer(local_20,*local_10,9);
                        local_10 = local_10 + 1;
                      }
                      *local_20 = *local_20 << ((char)local_bc * -9 + 0x1cU & 0x1f);
                    }
                    else {
                      bVar1 = Simple9<true,false>::tryme<2u,14u>(local_10,local_40);
                      if (bVar1) {
                        *local_20 = 7;
                        if (1 < local_40) {
                          local_c0 = 2;
                        }
                        local_2c = local_c0;
                        for (local_94 = 0; local_94 < local_c0; local_94 = local_94 + 1) {
                          bit_writer(local_20,*local_10,0xe);
                          local_10 = local_10 + 1;
                        }
                        *local_20 = *local_20 << ((char)local_c0 * -0xe + 0x1cU & 0x1f);
                      }
                      else {
                        if (*local_10 >> 0x1c != 0) {
                          fprintf(_stderr,"Input\'s out of range: %u\n",(ulong)*local_10);
                          prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error
                                    (prVar2,
                                     "You tried to apply Simple9 to an incompatible set of integers."
                                    );
                          __cxa_throw(prVar2,&std::runtime_error::typeinfo,
                                      std::runtime_error::~runtime_error);
                        }
                        *local_20 = 8;
                        local_2c = 1;
                        bit_writer(local_20,*local_10,0x1c);
                        local_10 = local_10 + 1;
                      }
                    }
                  }
                }
              }
            }
          }
        }
        local_20 = local_20 + 1;
        local_40 = local_40 - local_2c;
      } while( true );
    }
    bVar1 = Simple9<true,false>::trymefull<28u,1u>(local_10);
    if (bVar1) {
      *local_20 = 0;
      local_2c = 0x1c;
      for (local_48 = 0; local_48 < 0x1c; local_48 = local_48 + 1) {
        bit_writer(local_20,*local_10,1);
        local_10 = local_10 + 1;
      }
    }
    else {
      bVar1 = Simple9<true,false>::trymefull<14u,2u>(local_10);
      if (bVar1) {
        *local_20 = 1;
        local_2c = 0xe;
        for (local_4c = 0; local_4c < 0xe; local_4c = local_4c + 1) {
          bit_writer(local_20,*local_10,2);
          local_10 = local_10 + 1;
        }
      }
      else {
        bVar1 = Simple9<true,false>::trymefull<9u,3u>(local_10);
        if (bVar1) {
          *local_20 = 2;
          local_2c = 9;
          for (local_50 = 0; local_50 < 9; local_50 = local_50 + 1) {
            bit_writer(local_20,*local_10,3);
            local_10 = local_10 + 1;
          }
          *local_20 = *local_20 << 1;
        }
        else {
          bVar1 = Simple9<true,false>::trymefull<7u,4u>(local_10);
          if (bVar1) {
            *local_20 = 3;
            local_2c = 7;
            for (local_54 = 0; local_54 < 7; local_54 = local_54 + 1) {
              bit_writer(local_20,*local_10,4);
              local_10 = local_10 + 1;
            }
          }
          else {
            bVar1 = Simple9<true,false>::trymefull<5u,5u>(local_10);
            if (bVar1) {
              *local_20 = 4;
              local_2c = 5;
              for (local_58 = 0; local_58 < 5; local_58 = local_58 + 1) {
                bit_writer(local_20,*local_10,5);
                local_10 = local_10 + 1;
              }
              *local_20 = *local_20 << 3;
            }
            else {
              bVar1 = Simple9<true,false>::trymefull<4u,7u>(local_10);
              if (bVar1) {
                *local_20 = 5;
                local_2c = 4;
                for (local_5c = 0; local_5c < 4; local_5c = local_5c + 1) {
                  bit_writer(local_20,*local_10,7);
                  local_10 = local_10 + 1;
                }
              }
              else {
                bVar1 = Simple9<true,false>::trymefull<3u,9u>(local_10);
                if (bVar1) {
                  *local_20 = 6;
                  local_2c = 3;
                  for (local_60 = 0; local_60 < 3; local_60 = local_60 + 1) {
                    bit_writer(local_20,*local_10,9);
                    local_10 = local_10 + 1;
                  }
                  *local_20 = *local_20 << 1;
                }
                else {
                  bVar1 = Simple9<true,false>::trymefull<2u,14u>(local_10);
                  if (bVar1) {
                    *local_20 = 7;
                    local_2c = 2;
                    for (local_64 = 0; local_64 < 2; local_64 = local_64 + 1) {
                      bit_writer(local_20,*local_10,0xe);
                      local_10 = local_10 + 1;
                    }
                  }
                  else {
                    if (*local_10 >> 0x1c != 0) {
                      fprintf(_stderr,"Input\'s out of range: %u\n",(ulong)*local_10);
                      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error
                                (prVar2,
                                 "You tried to apply Simple9 to an incompatible set of integers.");
                      __cxa_throw(prVar2,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    *local_20 = 8;
                    local_2c = 1;
                    bit_writer(local_20,*local_10,0x1c);
                    local_10 = local_10 + 1;
                  }
                }
              }
            }
          }
        }
      }
    }
    local_20 = local_20 + 1;
    local_40 = local_40 - local_2c;
  } while( true );
}

Assistant:

void Simple9<MarkLength, hacked>::encodeArray(const uint32_t *in,
                                              const size_t length,
                                              uint32_t *out, size_t &nvalue) {
  uint32_t NumberOfValuesCoded;
  const uint32_t *const initout(out);
  if (MarkLength)
    *(out++) = uint32_t(length);
  size_t ValuesRemaining(length);
  // precompute
  const bool becareful = false;

  while (ValuesRemaining >= 28) {
    if (hacked && trymefull<28, 0>(in)) {
      out[0] = 9 << (32 - SIMPLE9_LOGDESC);
      NumberOfValuesCoded = 28;
      in += 28;
    } else if (trymefull<28, 1>(in)) {
      out[0] = 0;
      NumberOfValuesCoded = 28;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 1);
      if (becareful)
        assert(which(out) == 0);
    } else if (trymefull<14, 2>(in)) {
      out[0] = 1;
      NumberOfValuesCoded = 14;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 2);
      if (becareful)
        assert(which(out) == 1);
    } else if (trymefull<9, 3>(in)) {
      out[0] = 2;
      NumberOfValuesCoded = 9;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 3);
      *out <<= 28 - 3 * 9;
      if (becareful)
        assert(which(out) == 2);
    } else if (trymefull<7, 4>(in)) {
      out[0] = 3;

      NumberOfValuesCoded = 7;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 4);
      if (becareful)
        assert(which(out) == 7);
    } else if (trymefull<5, 5>(in)) {
      out[0] = 4;

      NumberOfValuesCoded = 5;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 5);
      *out <<= 28 - 5 * 5;
      if (becareful)
        assert(which(out) == 4);
    } else if (trymefull<4, 7>(in)) {
      out[0] = 5;
      NumberOfValuesCoded = 4;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 7);

      if (becareful)
        assert(which(out) == 5);
    } else if (trymefull<3, 9>(in)) {
      out[0] = 6;
      NumberOfValuesCoded = 3;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 9);
      *out <<= 28 - 9 * 3;
      if (becareful)
        assert(which(out) == 6);
    } else if (trymefull<2, 14>(in)) {
      out[0] = 7;

      NumberOfValuesCoded = 2;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 14);

      if (becareful)
        assert(which(out) == 14);
    } else {
      if ((*in >> 28) > 0) {
        fprintf(stderr, "Input's out of range: %u\n", *in);
        throw std::runtime_error(
            "You tried to apply Simple9 to an incompatible set of integers.");
      }

      out[0] = 8;

      NumberOfValuesCoded = 1;
      bit_writer(out, *in++, 28);
      if (becareful)
        assert(which(out) == 15);
    }

    ++out;

    ValuesRemaining -= NumberOfValuesCoded;
  }
  while (ValuesRemaining > 0) {
    if (hacked && trymefull<28, 0>(in)) {
      out[0] = 9 << (32 - SIMPLE9_LOGDESC);
      NumberOfValuesCoded = (ValuesRemaining < 28) ? uint32_t(ValuesRemaining) : 28;
      in += NumberOfValuesCoded;
    } else if (tryme<28, 1>(in, ValuesRemaining)) {
      out[0] = 0;

      NumberOfValuesCoded = (ValuesRemaining < 28) ? uint32_t(ValuesRemaining) : 28;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 1);
      *out <<= 28 - NumberOfValuesCoded;
      if (becareful)
        assert(which(out) == 0);
    } else if (tryme<14, 2>(in, ValuesRemaining)) {
      out[0] = 1;

      NumberOfValuesCoded = (ValuesRemaining < 14) ? uint32_t(ValuesRemaining) : 14;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 2);
      *out <<= 28 - 2 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out) == 1);
    } else if (tryme<9, 3>(in, ValuesRemaining)) {
      out[0] = 2;
      NumberOfValuesCoded = (ValuesRemaining < 9) ? uint32_t(ValuesRemaining) : 9;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 3);
      *out <<= 28 - 3 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out) == 2);
    } else if (tryme<7, 4>(in, ValuesRemaining)) {
      out[0] = 3;

      NumberOfValuesCoded = (ValuesRemaining < 7) ? uint32_t(ValuesRemaining) : 7;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 4);
      *out <<= 28 - 4 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out) == 7);
    } else if (tryme<5, 5>(in, ValuesRemaining)) {
      out[0] = 4;

      NumberOfValuesCoded = (ValuesRemaining < 5) ? uint32_t(ValuesRemaining) : 5;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 5);
      *out <<= 28 - 5 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out) == 4);
    } else if (tryme<4, 7>(in, ValuesRemaining)) {
      out[0] = 5;
      NumberOfValuesCoded = (ValuesRemaining < 4) ? uint32_t(ValuesRemaining) : 4;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 7);

      *out <<= 28 - 7 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out) == 5);
    } else if (tryme<3, 9>(in, ValuesRemaining)) {
      out[0] = 6;
      NumberOfValuesCoded = (ValuesRemaining < 3) ? uint32_t(ValuesRemaining) : 3;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 9);
      *out <<= 28 - 9 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out) == 6);
    } else if (tryme<2, 14>(in, ValuesRemaining)) {
      out[0] = 7;
      NumberOfValuesCoded = (ValuesRemaining < 2) ? uint32_t(ValuesRemaining) : 2;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 14);
      *out <<= 28 - 14 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out) == 14);
    } else {
      if ((*in >> 28) > 0) {
        fprintf(stderr, "Input's out of range: %u\n", *in);
        throw std::runtime_error(
            "You tried to apply Simple9 to an incompatible set of integers.");
      }
      out[0] = 8;
      NumberOfValuesCoded = 1;
      bit_writer(out, *in++, 28);
      if (becareful)
        assert(which(out) == 15);
    }
    ++out;
    ValuesRemaining -= NumberOfValuesCoded;
  }
  nvalue = out - initout;
}